

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O2

NodeData __thiscall
google::protobuf::compiler::
SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::DFS
          (SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator> *this,
          Descriptor *descriptor)

{
  pointer *pppDVar1;
  SCC *this_00;
  pointer ppDVar2;
  Descriptor *descriptor_00;
  long lVar3;
  int iVar4;
  size_type sVar5;
  LogMessage *pLVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  pointer ppDVar9;
  int iVar10;
  Descriptor *desc;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *pDVar11;
  Descriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  Descriptor *extraout_RDX_03;
  Descriptor *pDVar12;
  __normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
  __i;
  undefined8 *puVar13;
  pointer ppDVar14;
  NodeData NVar15;
  pair<std::_Rb_tree_iterator<const_google::protobuf::compiler::SCC_*>,_bool> pVar16;
  LogFinisher local_d9;
  mapped_type *local_d8;
  Descriptor *descriptor_local;
  Descriptor *dep;
  Descriptor *local_c0;
  pointer local_b0;
  pointer local_a8;
  vector<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
  *local_a0;
  Descriptor *scc_desc;
  set<const_google::protobuf::compiler::SCC_*,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
  seen;
  
  descriptor_local = descriptor;
  sVar5 = std::
          map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData>_>_>
          ::count(&this->cache_,&descriptor_local);
  if (sVar5 != 0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&scc_desc,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/scc.h"
               ,0x5c);
    pLVar6 = internal::LogMessage::operator<<
                       ((LogMessage *)&scc_desc,"CHECK failed: (cache_.count(descriptor)) == (0): ")
    ;
    internal::LogFinisher::operator=((LogFinisher *)&seen,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)&scc_desc);
  }
  local_d8 = std::
             map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData>_>_>
             ::operator[](&this->cache_,&descriptor_local);
  iVar4 = this->index_;
  this->index_ = iVar4 + 1;
  local_d8->lowlink = iVar4;
  local_d8->index = iVar4;
  std::
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::push_back(&this->stack_,&descriptor_local);
  js::anon_unknown_0::DepsGenerator::operator()
            ((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              *)&seen,(DepsGenerator *)descriptor_local,desc);
  puVar13 = (undefined8 *)seen._M_t._M_impl._0_8_;
  do {
    if (puVar13 ==
        (undefined8 *)
        CONCAT44(seen._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                 seen._M_t._M_impl.super__Rb_tree_header._M_header._M_color)) {
      std::
      _Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::~_Vector_base((_Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *)&seen);
      if (local_d8->index == local_d8->lowlink) {
        scc_desc = (Descriptor *)operator_new(0x30);
        *(undefined8 *)scc_desc = 0;
        *(undefined8 *)(scc_desc + 8) = 0;
        *(undefined8 *)(scc_desc + 0x10) = 0;
        *(undefined8 *)(scc_desc + 0x18) = 0;
        *(undefined8 *)(scc_desc + 0x20) = 0;
        *(undefined8 *)(scc_desc + 0x28) = 0;
        std::
        vector<std::unique_ptr<google::protobuf::compiler::SCC,std::default_delete<google::protobuf::compiler::SCC>>,std::allocator<std::unique_ptr<google::protobuf::compiler::SCC,std::default_delete<google::protobuf::compiler::SCC>>>>
        ::emplace_back<google::protobuf::compiler::SCC*>
                  ((vector<std::unique_ptr<google::protobuf::compiler::SCC,std::default_delete<google::protobuf::compiler::SCC>>,std::allocator<std::unique_ptr<google::protobuf::compiler::SCC,std::default_delete<google::protobuf::compiler::SCC>>>>
                    *)&this->garbage_bin_,(SCC **)&scc_desc);
        this_00 = (this->garbage_bin_).
                  super__Vector_base<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_google::protobuf::compiler::SCC_*,_std::default_delete<google::protobuf::compiler::SCC>_>
                  .super__Head_base<0UL,_google::protobuf::compiler::SCC_*,_false>._M_head_impl;
        do {
          scc_desc = (this->stack_).
                     super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1];
          std::
          vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::push_back(&this_00->descriptors,&scc_desc);
          pppDVar1 = &(this->stack_).
                      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppDVar1 = *pppDVar1 + -1;
          pmVar7 = std::
                   map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData>_>_>
                   ::operator[](&this->cache_,&scc_desc);
          pmVar7->scc = this_00;
        } while (scc_desc != descriptor_local);
        ppDVar9 = *(pointer *)
                   &(this_00->descriptors).
                    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    ._M_impl;
        ppDVar2 = *(pointer *)
                   ((long)&(this_00->descriptors).
                           super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                           ._M_impl + 8);
        pDVar11 = extraout_RDX;
        if (ppDVar9 != ppDVar2) {
          uVar8 = (long)ppDVar2 - (long)ppDVar9 >> 3;
          lVar3 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::DFS(google::protobuf::Descriptor_const*)::_lambda(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)_1_>>
                    (ppDVar9,ppDVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
          if ((long)ppDVar2 - (long)ppDVar9 < 0x81) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::DFS(google::protobuf::Descriptor_const*)::_lambda(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)_1_>>
                      (ppDVar9,ppDVar2);
            pDVar11 = extraout_RDX_02;
          }
          else {
            ppDVar14 = ppDVar9 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::DFS(google::protobuf::Descriptor_const*)::_lambda(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)_1_>>
                      (ppDVar9,ppDVar14);
            pDVar11 = extraout_RDX_00;
            for (; ppDVar14 != ppDVar2; ppDVar14 = ppDVar14 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::DFS(google::protobuf::Descriptor_const*)::_lambda(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)_1_>>
                        (ppDVar14);
              pDVar11 = extraout_RDX_01;
            }
          }
        }
        seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &seen._M_t._M_impl.super__Rb_tree_header._M_header;
        seen._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        seen._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_b0 = *(pointer *)
                    ((long)&(this_00->descriptors).
                            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                            ._M_impl + 8);
        local_a0 = &this_00->children;
        ppDVar9 = *(pointer *)
                   &(this_00->descriptors).
                    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    ._M_impl;
        seen._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (ppDVar9 != local_b0) {
          local_a8 = ppDVar9;
          js::anon_unknown_0::DepsGenerator::operator()
                    ((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      *)&dep,(DepsGenerator *)*ppDVar9,pDVar11);
          pDVar11 = local_c0;
          for (pDVar12 = dep; pDVar12 != pDVar11; pDVar12 = pDVar12 + 8) {
            descriptor_00 = *(Descriptor **)pDVar12;
            if (descriptor_00 == (Descriptor *)0x0) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)&scc_desc,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/scc.h"
                         ,0x90);
              pLVar6 = internal::LogMessage::operator<<
                                 ((LogMessage *)&scc_desc,"CHECK failed: child_msg: ");
              internal::LogFinisher::operator=(&local_d9,pLVar6);
              internal::LogMessage::~LogMessage((LogMessage *)&scc_desc);
            }
            scc_desc = (Descriptor *)GetSCC(this,descriptor_00);
            if ((SCC *)scc_desc != this_00) {
              pVar16 = std::
                       _Rb_tree<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::SCC_const*,std::_Identity<google::protobuf::compiler::SCC_const*>,std::less<google::protobuf::compiler::SCC_const*>,std::allocator<google::protobuf::compiler::SCC_const*>>
                       ::_M_insert_unique<google::protobuf::compiler::SCC_const*const&>
                                 ((_Rb_tree<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::SCC_const*,std::_Identity<google::protobuf::compiler::SCC_const*>,std::less<google::protobuf::compiler::SCC_const*>,std::allocator<google::protobuf::compiler::SCC_const*>>
                                   *)&seen,(SCC **)&scc_desc);
              if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                std::
                vector<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
                ::push_back(local_a0,(value_type *)&scc_desc);
              }
            }
          }
          std::
          _Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::~_Vector_base((_Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                           *)&dep);
          pDVar11 = extraout_RDX_03;
          ppDVar9 = local_a8 + 1;
        }
        std::
        _Rb_tree<const_google::protobuf::compiler::SCC_*,_const_google::protobuf::compiler::SCC_*,_std::_Identity<const_google::protobuf::compiler::SCC_*>,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
        ::~_Rb_tree(&seen._M_t);
      }
      NVar15.scc = local_d8->scc;
      NVar15.index = local_d8->index;
      NVar15.lowlink = local_d8->lowlink;
      return NVar15;
    }
    pDVar11 = (Descriptor *)*puVar13;
    dep = pDVar11;
    if (pDVar11 == (Descriptor *)0x0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&scc_desc,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/scc.h"
                 ,0x66);
      pLVar6 = internal::LogMessage::operator<<((LogMessage *)&scc_desc,"CHECK failed: dep: ");
      internal::LogFinisher::operator=(&local_d9,pLVar6);
      internal::LogMessage::~LogMessage((LogMessage *)&scc_desc);
    }
    sVar5 = std::
            map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData>_>_>
            ::count(&this->cache_,&dep);
    if (sVar5 == 0) {
      NVar15 = DFS(this,pDVar11);
      iVar10 = NVar15.lowlink;
      iVar4 = local_d8->lowlink;
LAB_002a4179:
      if (iVar4 < iVar10) {
        iVar10 = iVar4;
      }
      local_d8->lowlink = iVar10;
    }
    else {
      pmVar7 = std::
               map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData>_>_>
               ::operator[](&this->cache_,&dep);
      if (pmVar7->scc == (SCC *)0x0) {
        iVar4 = pmVar7->index;
        iVar10 = local_d8->lowlink;
        goto LAB_002a4179;
      }
    }
    puVar13 = puVar13 + 1;
  } while( true );
}

Assistant:

NodeData DFS(const Descriptor* descriptor) {
    // Must not have visited already.
    GOOGLE_DCHECK_EQ(cache_.count(descriptor), 0);

    // Mark visited by inserting in map.
    NodeData& result = cache_[descriptor];
    // Initialize data structures.
    result.index = result.lowlink = index_++;
    stack_.push_back(descriptor);

    // Recurse the fields / nodes in graph
    for (auto dep : DepsGenerator()(descriptor)) {
      GOOGLE_CHECK(dep);
      if (cache_.count(dep) == 0) {
        // unexplored node
        NodeData child_data = DFS(dep);
        result.lowlink = std::min(result.lowlink, child_data.lowlink);
      } else {
        NodeData child_data = cache_[dep];
        if (child_data.scc == nullptr) {
          // Still in the stack_ so we found a back edge
          result.lowlink = std::min(result.lowlink, child_data.index);
        }
      }
    }
    if (result.index == result.lowlink) {
      // This is the root of a strongly connected component
      SCC* scc = CreateSCC();
      while (true) {
        const Descriptor* scc_desc = stack_.back();
        scc->descriptors.push_back(scc_desc);
        // Remove from stack
        stack_.pop_back();
        cache_[scc_desc].scc = scc;

        if (scc_desc == descriptor) break;
      }

      // The order of descriptors is random and depends how this SCC was
      // discovered. In-order to ensure maximum stability we sort it by name.
      std::sort(scc->descriptors.begin(), scc->descriptors.end(),
                [](const Descriptor* a, const Descriptor* b) {
                  return a->full_name() < b->full_name();
                });
      AddChildren(scc);
    }
    return result;
  }